

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O0

float * __thiscall
delay_line<float>::output(delay_line<float> *this,uint32_t frames_needed,size_t *input_frames_used)

{
  size_t sVar1;
  size_t sVar2;
  float *pfVar3;
  ulong *in_RDX;
  uint in_ESI;
  auto_array<float> *in_RDI;
  size_t *length;
  float *in_stack_ffffffffffffffc8;
  auto_array<float> *this_00;
  auto_array<float> *in_stack_ffffffffffffffd0;
  
  sVar1 = auto_array<float>::capacity((auto_array<float> *)&in_RDI[1].length_);
  sVar2 = processor::frames_to_samples((processor *)in_RDI,(ulong)in_ESI);
  if (sVar1 < sVar2) {
    in_stack_ffffffffffffffd0 = (auto_array<float> *)&in_RDI[1].length_;
    processor::frames_to_samples((processor *)in_RDI,(ulong)in_ESI);
    auto_array<float>::reserve(in_RDI,(size_t)in_stack_ffffffffffffffd0);
  }
  auto_array<float>::clear((auto_array<float> *)&in_RDI[1].length_);
  length = &in_RDI[1].length_;
  pfVar3 = auto_array<float>::data((auto_array<float> *)&in_RDI->length_);
  processor::frames_to_samples((processor *)in_RDI,(ulong)in_ESI);
  auto_array<float>::push(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(size_t)pfVar3);
  this_00 = (auto_array<float> *)&in_RDI->length_;
  processor::frames_to_samples((processor *)in_RDI,(ulong)in_ESI);
  auto_array<float>::pop(this_00,pfVar3,(size_t)length);
  *in_RDX = (ulong)in_ESI;
  pfVar3 = auto_array<float>::data((auto_array<float> *)&in_RDI[1].length_);
  return pfVar3;
}

Assistant:

T * output(uint32_t frames_needed, size_t * input_frames_used)
  {
    if (delay_output_buffer.capacity() < frames_to_samples(frames_needed)) {
      delay_output_buffer.reserve(frames_to_samples(frames_needed));
    }

    delay_output_buffer.clear();
    delay_output_buffer.push(delay_input_buffer.data(),
                             frames_to_samples(frames_needed));
    delay_input_buffer.pop(nullptr, frames_to_samples(frames_needed));
    *input_frames_used = frames_needed;

    return delay_output_buffer.data();
  }